

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O0

void __thiscall
MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::set_control_line_output
          (MOS6522<Apple::II::Mockingboard::AYVIA> *this,Port port,Line line,LineState value)

{
  AYVIA *this_00;
  HalfCycles duration;
  LineState value_local;
  Line line_local;
  Port port_local;
  MOS6522<Apple::II::Mockingboard::AYVIA> *this_local;
  
  if ((port == B) && (line == Two)) {
    (this->super_MOS6522Storage).control_outputs_[1].lines[1] = value;
    evaluate_cb2_output(this);
  }
  else if ((value != (this->super_MOS6522Storage).control_outputs_[port].lines[line]) &&
          ((this->super_MOS6522Storage).control_outputs_[port].lines[line] = value, value != Input))
  {
    this_00 = this->bus_handler_;
    duration = WrappedInt<HalfCycles>::flush<HalfCycles>
                         (&(this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>);
    PortHandler::run_for((PortHandler *)this_00,duration);
    PortHandler::set_control_line_output((PortHandler *)this->bus_handler_,port,line,value != Off);
  }
  return;
}

Assistant:

void MOS6522<T>::set_control_line_output(Port port, Line line, LineState value) {
	if(port == Port::B && line == Line::Two) {
		control_outputs_[port].lines[line] = value;
		evaluate_cb2_output();
	} else {
		// Do nothing if unchanged.
		if(value == control_outputs_[port].lines[line]) {
			return;
		}

		control_outputs_[port].lines[line] = value;

		if(value != LineState::Input) {
			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			bus_handler_.set_control_line_output(port, line, value != LineState::Off);
		}
	}
}